

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauMerge.c
# Opt level: O1

void Dau_DsdRemoveBraces_rec(char *pStr,char **p,int *pMatches)

{
  uint uVar1;
  byte *pbVar2;
  byte bVar3;
  char *pcVar4;
  char cVar5;
  byte *pbVar6;
  byte *pbVar7;
  
  if (**p == '!') {
    *p = *p + 1;
  }
  pcVar4 = *p;
  cVar5 = *pcVar4;
  if ((byte)(cVar5 + 0xbfU) < 6 || (byte)(cVar5 - 0x30U) < 10) {
    do {
      pcVar4 = pcVar4 + 1;
      *p = pcVar4;
      cVar5 = *pcVar4;
    } while ((byte)(cVar5 - 0x30U) < 10 || (byte)(cVar5 + 0xbfU) < 6);
  }
  if ((cVar5 == '<') && (pStr[(long)pMatches[(long)pcVar4 - (long)pStr] + 1] == '{')) {
    *p = pStr + (long)pMatches[(long)pcVar4 - (long)pStr] + 1;
  }
  pbVar6 = (byte *)*p;
  bVar3 = *pbVar6;
  if (0x19 < (byte)(bVar3 + 0x9f)) {
    uVar1 = bVar3 - 0x3c;
    if (((0x3f < uVar1) || ((0x8000000080000001U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) &&
       (bVar3 != 0x28)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                    ,0x228,"void Dau_DsdRemoveBraces_rec(char *, char **, int *)");
    }
    if ((int)(char)bVar3 + (uint)(bVar3 != 0x28) + 1 !=
        (int)pStr[pMatches[(long)pbVar6 - (long)pStr]]) {
      __assert_fail("*q == **p + 1 + (**p != \'(\')",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                    ,0x219,"void Dau_DsdRemoveBraces_rec(char *, char **, int *)");
    }
    pbVar7 = (byte *)(pStr + pMatches[(long)pbVar6 - (long)pStr]);
    while( true ) {
      pbVar2 = pbVar6 + 1;
      *p = (char *)pbVar2;
      if (pbVar7 <= pbVar2) break;
      bVar3 = pbVar6[1];
      Dau_DsdRemoveBraces_rec(pStr,p,pMatches);
      pbVar6 = pbVar6 + 2;
      if ((((bVar3 != 0x21) && (pbVar6 = pbVar2, *pbVar2 == 0x28)) && (*pbVar7 == 0x29)) ||
         ((*pbVar6 == 0x5b && (*pbVar7 == 0x5d)))) {
        cVar5 = **p;
        if ((cVar5 != ')') && (cVar5 != ']')) {
          __assert_fail("**p == \')\' || **p == \']\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                        ,0x221,"void Dau_DsdRemoveBraces_rec(char *, char **, int *)");
        }
        **p = ' ';
        *pbVar6 = 0x20;
      }
      pbVar6 = (byte *)*p;
    }
    if (pbVar2 != pbVar7) {
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                    ,0x225,"void Dau_DsdRemoveBraces_rec(char *, char **, int *)");
    }
  }
  return;
}

Assistant:

void Dau_DsdRemoveBraces_rec( char * pStr, char ** p, int * pMatches )
{
    if ( **p == '!' )
        (*p)++;
    while ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
        (*p)++;
    if ( **p == '<' )
    {
        char * q = pStr + pMatches[*p - pStr];
        if ( *(q+1) == '{' )
            *p = q+1;
    }
    if ( **p >= 'a' && **p <= 'z' ) // var
        return;
    if ( **p == '(' || **p == '[' || **p == '<' || **p == '{' ) 
    {
        char * q = pStr + pMatches[ *p - pStr ];
        assert( *q == **p + 1 + (**p != '(') );
        for ( (*p)++; *p < q; (*p)++ )
        {
            int fCompl = (**p == '!');
            char * pBeg = fCompl ? *p + 1 : *p;
            Dau_DsdRemoveBraces_rec( pStr, p, pMatches );
            if ( (!fCompl && *pBeg == '(' && *q == ')') || (*pBeg == '[' && *q == ']') )
            {
                assert( **p == ')' || **p == ']' );
                *pBeg = **p = ' ';
            }
        }
        assert( *p == q );
        return;
    }
    assert( 0 );
}